

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O1

void __thiscall Outputs::Display::BufferingScanTarget::will_change_owner(BufferingScanTarget *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->producer_mutex_);
  if (iVar1 == 0) {
    this->allocation_has_failed_ = true;
    this->vended_scan_ = (Scan *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->producer_mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void BufferingScanTarget::will_change_owner() {
	std::lock_guard lock_guard(producer_mutex_);
	allocation_has_failed_ = true;
	vended_scan_ = nullptr;
#ifdef DEBUG
	data_is_allocated_ = false;
#endif
}